

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_clock_constraint
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *first,typed_expression_t *second,ineq_cmp_t cmp,
          typed_expression_t *bound)

{
  value_type_conflict4 local_78 [3];
  value_type_conflict4 local_60 [3];
  vector<long,_std::allocator<long>_> *local_48;
  undefined1 local_40 [8];
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  clocks_compiler;
  typed_expression_t *bound_local;
  ineq_cmp_t cmp_local;
  typed_expression_t *second_local;
  typed_expression_t *first_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  local_48 = (this->_bytecode_back_inserter).container;
  clocks_compiler._bytecode_back_inserter.container = (vector<long,_std::allocator<long>_> *)bound;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::lvalue_expression_compiler_t
            ((lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_40,(back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)local_48);
  (**(code **)(*(long *)first + 0x30))
            (first,(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
                    *)local_40);
  (**(code **)(*(long *)second + 0x30))(second,local_40);
  (*(code *)((clocks_compiler._bytecode_back_inserter.container)->
            super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_start[6])(clocks_compiler._bytecode_back_inserter.container,this);
  local_60[0] = 0x16;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,local_60);
  local_78[2] = (value_type_conflict4)cmp;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,local_78 + 2);
  local_78[1] = 5;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,local_78 + 1);
  local_78[0] = 1;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,local_78);
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~lvalue_expression_compiler_t
            ((lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_40);
  return;
}

Assistant:

void compile_clock_constraint(tchecker::typed_expression_t const & first, tchecker::typed_expression_t const & second,
                                enum tchecker::ineq_cmp_t cmp, tchecker::typed_expression_t const & bound)
  {
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> clocks_compiler(_bytecode_back_inserter);

    first.visit(clocks_compiler);
    second.visit(clocks_compiler);
    bound.visit(*this);
    _bytecode_back_inserter = tchecker::VM_CLKCONSTR;
    _bytecode_back_inserter = cmp;
    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = 1;
  }